

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

void writefv(FILE *f,char *fmt,__va_list_tag *v)

{
  undefined4 uVar1;
  uint uVar2;
  int x_00;
  __va_list_tag *p_Var3;
  int *local_78;
  undefined4 *local_60;
  uint *local_48;
  int32 x_2;
  int16 x_1;
  uint8 x;
  __va_list_tag *v_local;
  char *fmt_local;
  FILE *f_local;
  
  v_local = (__va_list_tag *)fmt;
  while ((char)v_local->gp_offset != '\0') {
    p_Var3 = (__va_list_tag *)((long)&v_local->gp_offset + 1);
    switch((char)v_local->gp_offset) {
    case ' ':
      v_local = p_Var3;
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/meruiden[P]CS3D/external/soil/src/stb_image_aug.c"
                    ,0xe04,"void writefv(FILE *, char *, struct __va_list_tag *)");
    case '1':
      uVar2 = v->gp_offset;
      if (uVar2 < 0x29) {
        local_48 = (uint *)((long)(int)uVar2 + (long)v->reg_save_area);
        v->gp_offset = uVar2 + 8;
      }
      else {
        local_48 = (uint *)v->overflow_arg_area;
        v->overflow_arg_area = local_48 + 2;
      }
      write8(f,*local_48 & 0xff);
      v_local = p_Var3;
      break;
    case '2':
      uVar2 = v->gp_offset;
      if (uVar2 < 0x29) {
        local_60 = (undefined4 *)((long)(int)uVar2 + (long)v->reg_save_area);
        v->gp_offset = uVar2 + 8;
      }
      else {
        local_60 = (undefined4 *)v->overflow_arg_area;
        v->overflow_arg_area = local_60 + 2;
      }
      uVar1 = *local_60;
      write8(f,(int)(short)uVar1);
      write8(f,(int)(short)uVar1 >> 8);
      v_local = p_Var3;
      break;
    case '4':
      uVar2 = v->gp_offset;
      if (uVar2 < 0x29) {
        local_78 = (int *)((long)(int)uVar2 + (long)v->reg_save_area);
        v->gp_offset = uVar2 + 8;
      }
      else {
        local_78 = (int *)v->overflow_arg_area;
        v->overflow_arg_area = local_78 + 2;
      }
      x_00 = *local_78;
      write8(f,x_00);
      write8(f,x_00 >> 8);
      write8(f,x_00 >> 0x10);
      write8(f,x_00 >> 0x18);
      v_local = p_Var3;
    }
  }
  return;
}

Assistant:

static void writefv(FILE *f, char *fmt, va_list v)
{
   while (*fmt) {
      switch (*fmt++) {
         case ' ': break;
         case '1': { uint8 x = va_arg(v, int); write8(f,x); break; }
         case '2': { int16 x = va_arg(v, int); write8(f,x); write8(f,x>>8); break; }
         case '4': { int32 x = va_arg(v, int); write8(f,x); write8(f,x>>8); write8(f,x>>16); write8(f,x>>24); break; }
         default:
            assert(0);
            va_end(v);
            return;
      }
   }
}